

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostref.c
# Opt level: O1

wasm_ref_t * call_v_r(wasm_func_t *func)

{
  long lVar1;
  wasm_val_t rs [1];
  wasm_val_vec_t args;
  wasm_val_vec_t results;
  undefined8 local_38;
  wasm_ref_t *pwStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined1 *local_10;
  
  printf("call_v_r... ");
  fflush(_stdout);
  local_38 = 0x80;
  pwStack_30 = (wasm_ref_t *)0x0;
  local_28 = 0;
  uStack_20 = 0;
  local_18 = 1;
  local_10 = (undefined1 *)&local_38;
  lVar1 = wasm_func_call(func);
  if (lVar1 == 0) {
    puts("okay");
    return pwStack_30;
  }
  puts("> Error calling function!");
  exit(1);
}

Assistant:

own wasm_ref_t* call_v_r(const wasm_func_t* func) {
  printf("call_v_r... "); fflush(stdout);
  wasm_val_t rs[] = { WASM_INIT_VAL };
  wasm_val_vec_t args = WASM_EMPTY_VEC;
  wasm_val_vec_t results = WASM_ARRAY_VEC(rs);
  if (wasm_func_call(func, &args, &results)) {
    printf("> Error calling function!\n");
    exit(1);
  }
  printf("okay\n");
  return rs[0].of.ref;
}